

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O1

bool chapter2::find_elem(int pos,int *elem)

{
  long *plVar1;
  int iVar2;
  
  if ((uint)pos < 0x41) {
    pent_series(pos);
    iVar2 = pent_series::elem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(ulong)(uint)pos - 1];
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Sorry, Invalid position.",0x18);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,pos);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    iVar2 = 0;
  }
  *elem = iVar2;
  return (uint)pos < 0x41;
}

Assistant:

bool find_elem(int pos, int &elem) {
        if (!check_validity(pos)) {
            cerr << "Sorry, Invalid position." << pos << endl;
            elem = 0;
            return false;
        }

        const vector<int> * ptr = pent_series(pos);
        elem = (*ptr)[pos - 1];
        return true;
    }